

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

string * amrex::UniqueString_abi_cxx11_(void)

{
  string *in_RDI;
  double dVar1;
  string local_1c0 [32];
  stringstream tempstring;
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&tempstring);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0xb;
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xfffffefb | 4;
  dVar1 = ParallelDescriptor::second();
  std::ostream::_M_insert<double>(dVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&tempstring);
  return in_RDI;
}

Assistant:

std::string
amrex::UniqueString()
{
  std::stringstream tempstring;
  tempstring << std::setprecision(11) << std::fixed << ParallelDescriptor::second();
  int tsl(tempstring.str().length());
  return(tempstring.str().substr(tsl/2, tsl));
}